

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Worker::Run(Worker *this)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  CURLMcode err;
  long lVar5;
  int *piVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  char *__s;
  size_t sVar9;
  long *plVar10;
  ssize_t sVar11;
  CurlException *this_00;
  _Base_ptr p_Var12;
  int iVar13;
  pthread_mutex_t *__mutex;
  ulong uVar14;
  uint uVar15;
  undefined8 unaff_R15;
  const_iterator __position;
  int transfers_running;
  int maxfd;
  long sleep_duration;
  int numLeft;
  timeval tv;
  lock_t lock;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_220;
  undefined1 local_219;
  int local_218;
  uint local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  timeval local_1f8;
  pthread_mutex_t *local_1e8;
  map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
  *local_1e0;
  string local_1d8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_220 = -1;
  local_1b8.fds_bits[0xe] = 0;
  local_1b8.fds_bits[0xf] = 0;
  local_1b8.fds_bits[0xc] = 0;
  local_1b8.fds_bits[0xd] = 0;
  local_1b8.fds_bits[10] = 0;
  local_1b8.fds_bits[0xb] = 0;
  local_1b8.fds_bits[8] = 0;
  local_1b8.fds_bits[9] = 0;
  local_1b8.fds_bits[6] = 0;
  local_1b8.fds_bits[7] = 0;
  local_1b8.fds_bits[4] = 0;
  local_1b8.fds_bits[5] = 0;
  local_1b8.fds_bits[2] = 0;
  local_1b8.fds_bits[3] = 0;
  local_1b8.fds_bits[0] = 0;
  local_1b8.fds_bits[1] = 0;
  local_b8.fds_bits[0xe] = 0;
  local_b8.fds_bits[0xf] = 0;
  local_b8.fds_bits[0xc] = 0;
  local_b8.fds_bits[0xd] = 0;
  local_b8.fds_bits[10] = 0;
  local_b8.fds_bits[0xb] = 0;
  local_b8.fds_bits[8] = 0;
  local_b8.fds_bits[9] = 0;
  local_b8.fds_bits[6] = 0;
  local_b8.fds_bits[7] = 0;
  local_b8.fds_bits[4] = 0;
  local_b8.fds_bits[5] = 0;
  local_b8.fds_bits[2] = 0;
  local_b8.fds_bits[3] = 0;
  local_b8.fds_bits[0] = 0;
  local_b8.fds_bits[1] = 0;
  local_138.fds_bits[0xe] = 0;
  local_138.fds_bits[0xf] = 0;
  local_138.fds_bits[0xc] = 0;
  local_138.fds_bits[0xd] = 0;
  local_138.fds_bits[10] = 0;
  local_138.fds_bits[0xb] = 0;
  local_138.fds_bits[8] = 0;
  local_138.fds_bits[9] = 0;
  local_138.fds_bits[6] = 0;
  local_138.fds_bits[7] = 0;
  local_138.fds_bits[4] = 0;
  local_138.fds_bits[5] = 0;
  local_138.fds_bits[2] = 0;
  local_138.fds_bits[3] = 0;
  local_138.fds_bits[0] = 0;
  local_138.fds_bits[1] = 0;
  local_208 = std::chrono::_V2::steady_clock::now();
  local_208 = local_208 + 60000000000;
  local_1e0 = &this->ongoing_;
  p_Var1 = &(this->ongoing_)._M_t._M_impl.super__Rb_tree_header;
  __mutex = (pthread_mutex_t *)&this->mutex_;
  uVar14 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  local_1e8 = __mutex;
  do {
    bVar3 = EvaluateState(this,local_220 != 0,(bool)((byte)uVar14 & 1));
    if (!bVar3) break;
    if ((uVar14 & 1) != 0) {
      Dequeue(this);
      uVar14 = 0;
    }
    iVar4 = local_220;
    curl_multi_perform(this->handle_,&local_220);
    if ((local_220 == 0) && (iVar4 == -1)) {
      local_220 = -1;
    }
    iVar4 = local_220;
    lVar5 = std::chrono::_V2::steady_clock::now();
    local_214 = (uint)uVar14;
    if (iVar4 < 1) {
      if (lVar5 <= local_208) goto LAB_0010a2af;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"Idle timeout. Will shut down the worker-thread.",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      bVar3 = false;
    }
    else {
      local_208 = lVar5 + 60000000000;
LAB_0010a2af:
      local_1fc = 0;
      do {
        piVar6 = (int *)curl_multi_info_read(this->handle_,&local_1fc);
        if (piVar6 == (int *)0x0) break;
        p_Var12 = (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        if (p_Var12 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var12 + 1) >= *(ulong *)(piVar6 + 2)) {
              p_Var7 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < *(ulong *)(piVar6 + 2)];
          } while (p_Var12 != (_Base_ptr)0x0);
        }
        __position._M_node = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (__position._M_node = p_Var7, *(ulong *)(piVar6 + 2) < *(ulong *)(p_Var7 + 1))) {
          __position._M_node = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)__position._M_node == p_Var1) {
          poVar8 = std::operator<<((ostream *)&std::clog,"Failed to find easy_handle in ongoing!");
          std::endl<char,std::char_traits<char>>(poVar8);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x3ed,"void restincurl::Worker::Run()");
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"Finishing request with easy-handle: ",0x24);
        if (*(long *)__position._M_node[1]._M_parent == 0) {
LAB_0010a7bd:
          __assert_fail("eh_",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x1fb,"EasyHandle &restincurl::Request::GetEasyHandle()");
        }
        poVar8 = std::ostream::_M_insert<void_const*>(&std::clog);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; with result: ",0xf);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,piVar6[4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," expl: \'",8);
        __s = (char *)curl_easy_strerror(piVar6[4]);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar9 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'; with msg: ",0xd);
        plVar10 = (long *)std::ostream::operator<<(poVar8,*piVar6);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        Request::CallCompletion((Request *)__position._M_node[1]._M_parent,piVar6[4]);
        if (*piVar6 == 1) {
          curl_multi_remove_handle(this->handle_,*(undefined8 *)(piVar6 + 2));
        }
        if (*(EasyHandle **)__position._M_node[1]._M_parent == (EasyHandle *)0x0) goto LAB_0010a7bd;
        EasyHandle::Close(*(EasyHandle **)__position._M_node[1]._M_parent);
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>,_std::_Select1st<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
        ::_M_erase_aux(&local_1e0->_M_t,__position);
      } while (piVar6 != (int *)0x0);
      __mutex = local_1e8;
      iVar4 = pthread_mutex_lock(local_1e8);
      uVar15 = local_214;
      if (iVar4 != 0) goto LAB_0010a816;
      iVar4 = 3;
      if ((this->abort_ == false) && ((local_220 != 0 || (this->close_pending_ == false)))) {
        iVar4 = 0;
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      pthread_mutex_unlock(__mutex);
      if (bVar3) {
        lVar5 = std::chrono::_V2::steady_clock::now();
        local_210 = (local_208 - lVar5) / 1000000;
        if (local_210 < 2) {
          local_210 = 1;
        }
        local_1b8.fds_bits[0] = 0;
        local_1b8.fds_bits[1] = 0;
        local_1b8.fds_bits[2] = 0;
        local_1b8.fds_bits[3] = 0;
        local_1b8.fds_bits[4] = 0;
        local_1b8.fds_bits[5] = 0;
        local_1b8.fds_bits[6] = 0;
        local_1b8.fds_bits[7] = 0;
        local_1b8.fds_bits[8] = 0;
        local_1b8.fds_bits[9] = 0;
        local_1b8.fds_bits[10] = 0;
        local_1b8.fds_bits[0xb] = 0;
        local_1b8.fds_bits[0xc] = 0;
        local_1b8.fds_bits[0xd] = 0;
        local_1b8.fds_bits[0xe] = 0;
        local_1b8.fds_bits[0xf] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_138.fds_bits[0xe] = 0;
        local_138.fds_bits[0xf] = 0;
        local_138.fds_bits[0xc] = 0;
        local_138.fds_bits[0xd] = 0;
        local_138.fds_bits[10] = 0;
        local_138.fds_bits[0xb] = 0;
        local_138.fds_bits[8] = 0;
        local_138.fds_bits[9] = 0;
        local_138.fds_bits[6] = 0;
        local_138.fds_bits[7] = 0;
        local_138.fds_bits[4] = 0;
        local_138.fds_bits[5] = 0;
        local_138.fds_bits[2] = 0;
        local_138.fds_bits[3] = 0;
        local_138.fds_bits[0] = 0;
        local_138.fds_bits[1] = 0;
        local_218 = -1;
        if (0 < local_220) {
          curl_multi_timeout(this->handle_,&local_210);
          if (local_210 < 0) {
            local_210 = 1000;
          }
          err = curl_multi_fdset(this->handle_,&local_1b8,&local_b8,&local_138,&local_218);
          if (err != CURLM_OK) goto LAB_0010a81d;
          if (local_218 == -1) {
            local_210 = 0x32;
          }
        }
        local_1f8.tv_sec = local_210 / 1000;
        local_1f8.tv_usec = (local_210 % 1000) * 1000;
        iVar4 = (this->signal_).pipefd_._M_elems[0];
        iVar13 = iVar4 + 0x3f;
        if (-1 < iVar4) {
          iVar13 = iVar4;
        }
        uVar14 = 1L << ((byte)iVar4 & 0x3f);
        local_1b8.fds_bits[iVar13 >> 6] = local_1b8.fds_bits[iVar13 >> 6] | uVar14;
        if (local_218 < iVar4) {
          local_218 = iVar4;
        }
        local_218 = local_218 + 1;
        iVar4 = select(local_218,&local_1b8,&local_b8,&local_138,&local_1f8);
        uVar15 = local_214;
        if ((0 < iVar4) && ((local_1b8.fds_bits[iVar13 >> 6] & uVar14) != 0)) {
          local_219 = 0;
          uVar2 = 0;
          do {
            uVar15 = uVar2;
            sVar11 = read((this->signal_).pipefd_._M_elems[0],&local_219,1);
            uVar2 = 1;
          } while (0 < sVar11);
        }
        uVar15 = uVar15 & 0xff;
        if (this->pending_entries_in_queue_ != false) {
          uVar15 = 1;
        }
        iVar4 = 0;
      }
      uVar14 = (ulong)uVar15;
      bVar3 = iVar4 == 0;
    }
  } while (bVar3);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    if ((this->close_pending_ != false) || (this->abort_ == true)) {
      this->done_ = true;
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
LAB_0010a816:
  err = std::__throw_system_error(iVar4);
LAB_0010a81d:
  this_00 = (CurlException *)__cxa_allocate_exception(0x18);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"curl_multi_fdset","");
  CurlException::CurlException(this_00,&local_1d8,err);
  __cxa_throw(this_00,&CurlException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Run() {
            int transfers_running = -1;
            fd_set fdread = {};
            fd_set fdwrite = {};
            fd_set fdexcep = {};
            bool do_dequeue = true;
            auto timeout = GetNextTimeout();

            while (EvaluateState(transfers_running, do_dequeue)) {

                if (do_dequeue) {
                    Dequeue();
                    do_dequeue = false;
                }

                /* timeout or readable/writable sockets */
                const bool initial_ideling = transfers_running == -1;
                curl_multi_perform(handle_, &transfers_running);
                if ((transfers_running == 0) && initial_ideling) {
                    transfers_running = -1; // Let's ignore close_pending_ until we have seen a request
                }

                // Shut down the thread if we have been idling too long
                if (transfers_running <= 0) {
                    if (timeout < std::chrono::steady_clock::now()) {
                        RESTINCURL_LOG("Idle timeout. Will shut down the worker-thread.");
                        break;
                    }
                } else {
                    timeout = GetNextTimeout();
                }

                int numLeft = {};
                while (auto m = curl_multi_info_read(handle_, &numLeft)) {
                    assert(m);
                    auto it = ongoing_.find(m->easy_handle);
                    if (it != ongoing_.end()) {
                        RESTINCURL_LOG("Finishing request with easy-handle: "
                            << (EasyHandle::handle_t)it->second->GetEasyHandle()
                            << "; with result: " << m->data.result << " expl: '" << curl_easy_strerror(m->data.result)
                            << "'; with msg: " << m->msg);

                        try {
                            it->second->Complete(m->data.result, m->msg);
                        } catch(const std::exception& ex) {
                            RESTINCURL_LOG("Complete threw: " << ex.what());
                        }
                        if (m->msg == CURLMSG_DONE) {
                            curl_multi_remove_handle(handle_, m->easy_handle);
                        }
                        it->second->GetEasyHandle().Close();
                        ongoing_.erase(it);
                    } else {
                        RESTINCURL_LOG("Failed to find easy_handle in ongoing!");
                        assert(false);
                    }
                }

                {
                    lock_t lock(mutex_);
                    // Avoid using select() as a timer when we need to exit anyway
                    if (abort_ || (!transfers_running && close_pending_)) {
                        break;
                    }
                }

                auto next_timeout = std::chrono::duration_cast<std::chrono::milliseconds>(
                    timeout - std::chrono::steady_clock::now());
                long sleep_duration = std::max<long>(1, next_timeout.count());
                /* extract sleep_duration value */


                FD_ZERO(&fdread);
                FD_ZERO(&fdwrite);
                FD_ZERO(&fdexcep);

                int maxfd = -1;
                if (transfers_running > 0) {
                    curl_multi_timeout(handle_, &sleep_duration);
                    if (sleep_duration < 0) {
                        sleep_duration = 1000;
                    }

                    /* get file descriptors from the transfers */
                    const auto mc = curl_multi_fdset(handle_, &fdread, &fdwrite, &fdexcep, &maxfd);
                    RESTINCURL_LOG_TRACE("maxfd: " << maxfd);
                    if (mc != CURLM_OK) {
                        throw CurlException("curl_multi_fdset", mc);
                    }

                    if (maxfd == -1) {
                        // Curl want's us to revisit soon
                        sleep_duration = 50;
                    }
                } // active transfers

                struct timeval tv = {};
                tv.tv_sec = sleep_duration / 1000;
                tv.tv_usec = (sleep_duration % 1000) * 1000;

                const auto signalfd = signal_.GetReadFd();

                RESTINCURL_LOG_TRACE("Calling select() with timeout of "
                    << sleep_duration
                    << " ms. Next timeout in " << next_timeout.count() << " ms. "
                    << transfers_running << " active transfers.");

                FD_SET(signalfd, &fdread);
                maxfd = std::max(signalfd,  maxfd) + 1;

                const auto rval = select(maxfd, &fdread, &fdwrite, &fdexcep, &tv);
                RESTINCURL_LOG_TRACE("select(" << maxfd << ") returned: " << rval);

                if (rval > 0) {
                    if (FD_ISSET(signalfd, &fdread)) {
                        RESTINCURL_LOG_TRACE("FD_ISSET was true: ");
                        do_dequeue = signal_.WasSignalled();
                    }

                }
                if (pending_entries_in_queue_) {
                    do_dequeue = true;
                }
            } // loop


            lock_t lock(mutex_);
            if (close_pending_ || abort_) {
                done_ = true;
            }
        }